

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

optional<pbrt::BSDFSample> * __thiscall
pbrt::DiffuseBxDF::Sample_f
          (optional<pbrt::BSDFSample> *__return_storage_ptr__,DiffuseBxDF *this,Vector3f wo,Float uc
          ,Point2f u,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int i;
  long lVar11;
  undefined8 uVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  ulong in_XMM0_Qb;
  undefined1 auVar18 [64];
  undefined1 auVar20 [56];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar25 [56];
  undefined1 in_register_000012c8 [56];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  SampledSpectrum SVar28;
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wi;
  Vector3f wi_00;
  undefined1 local_68 [16];
  float local_58;
  undefined1 auVar19 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  
  auVar22._4_60_ = wo._12_60_;
  auVar22._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  wo_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18 = ZEXT464((uint)(this->R).values.values[0]);
  lVar11 = 1;
  auVar21 = auVar22._0_16_;
  do {
    pfVar1 = (this->R).values.values + lVar11;
    lVar11 = lVar11 + 1;
    auVar3 = vmaxss_avx(ZEXT416((uint)*pfVar1),auVar18._0_16_);
    auVar18 = ZEXT1664(auVar3);
  } while (lVar11 != 4);
  auVar18 = ZEXT464((uint)(this->T).values.values[0]);
  lVar11 = 5;
  do {
    pfVar1 = (this->R).values.values + lVar11;
    lVar11 = lVar11 + 1;
    auVar15 = vmaxss_avx(ZEXT416((uint)*pfVar1),auVar18._0_16_);
    auVar18 = ZEXT1664(auVar15);
  } while (lVar11 != 8);
  fVar7 = (float)((uint)((byte)sampleFlags & 1) * auVar3._0_4_);
  fVar8 = (float)((uint)((sampleFlags & Transmission) != Unset) * auVar15._0_4_);
  if (((fVar7 != 0.0) || (fVar8 != 0.0)) || (NAN(fVar8))) {
    auVar15._0_4_ = u.super_Tuple2<pbrt::Point2,_float>.x + u.super_Tuple2<pbrt::Point2,_float>.x;
    auVar15._4_4_ = u.super_Tuple2<pbrt::Point2,_float>.y + u.super_Tuple2<pbrt::Point2,_float>.y;
    auVar15._8_4_ = in_register_000012c8._0_4_ + in_register_000012c8._0_4_;
    auVar15._12_4_ = in_register_000012c8._4_4_ + in_register_000012c8._4_4_;
    auVar3._8_4_ = 0xbf800000;
    auVar3._0_8_ = 0xbf800000bf800000;
    auVar3._12_4_ = 0xbf800000;
    auVar15 = vaddps_avx512vl(auVar15,auVar3);
    uVar4 = vcmpps_avx512vl(auVar15,ZEXT816(0),0);
    auVar3 = vmovshdup_avx(auVar15);
    uVar5 = vcmpps_avx512vl(auVar3,ZEXT816(0),0);
    local_68._0_12_ = ZEXT812(0);
    local_68._12_4_ = 0;
    fVar17 = auVar15._0_4_;
    fVar14 = auVar3._0_4_;
    if (fVar7 / (fVar7 + fVar8) <= uc) {
      if ((uVar4 & uVar5 & 1) == 0) {
        auVar21._8_4_ = 0x7fffffff;
        auVar21._0_8_ = 0x7fffffff7fffffff;
        auVar21._12_4_ = 0x7fffffff;
        auVar16 = vandps_avx512vl(auVar15,auVar21);
        auVar27._0_4_ = fVar17 / fVar14;
        auVar27._4_12_ = auVar15._4_12_;
        auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar27,ZEXT416(0x3fc90fdb));
        auVar21 = vshufps_avx(auVar16,auVar16,0xf5);
        bVar6 = auVar21._0_4_ < auVar16._0_4_;
        fVar13 = (float)((uint)bVar6 * (int)((fVar14 / fVar17) * 0.7853982) +
                        (uint)!bVar6 * auVar3._0_4_);
        fVar14 = (float)((uint)bVar6 * (int)fVar17 + (uint)!bVar6 * (int)fVar14);
        fVar17 = cosf(fVar13);
        fVar13 = sinf(fVar13);
        auVar21 = ZEXT416((uint)auVar22._0_4_);
        local_68 = vinsertps_avx(ZEXT416((uint)(fVar14 * fVar17)),ZEXT416((uint)(fVar14 * fVar13)),
                                 0x10);
      }
      auVar3 = vmovshdup_avx(local_68);
      auVar15 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),local_68,local_68);
      auVar3 = vfnmadd213ss_fma(auVar3,auVar3,auVar15);
      uVar12 = vcmpss_avx512f(ZEXT816(0) << 0x20,auVar21,1);
      bVar6 = (bool)((byte)uVar12 & 1);
      auVar3 = vmaxss_avx(auVar3,ZEXT816(0) << 0x20);
      auVar3 = vsqrtss_avx(auVar3,auVar3);
      auVar16._8_4_ = 0x80000000;
      auVar16._0_8_ = 0x8000000080000000;
      auVar16._12_4_ = 0x80000000;
      auVar15 = vxorps_avx512vl(auVar3,auVar16);
      local_58 = (float)((uint)bVar6 * auVar15._0_4_ + (uint)!bVar6 * (int)auVar3._0_4_);
      fVar14 = fVar8 * auVar3._0_4_ * 0.31830987;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.z = auVar21._0_4_;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)wo_00.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)wo_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ >> 0x20);
      auVar25 = ZEXT856(auVar21._8_8_);
      auVar20 = ZEXT856(in_XMM0_Qb);
      wi_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_68._0_8_;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.z = local_58;
      SVar28 = f(this,wo_01,wi_00,mode);
      auVar24._0_8_ = SVar28.values.values._8_8_;
      auVar24._8_56_ = auVar25;
      auVar18._0_8_ = SVar28.values.values._0_8_;
      auVar18._8_56_ = auVar20;
      auVar21 = vmovlhps_avx(auVar18._0_16_,auVar24._0_16_);
      __return_storage_ptr__->set = true;
      uVar12 = 0x3f80000000000006;
    }
    else {
      if ((uVar4 & uVar5 & 1) == 0) {
        auVar9._8_4_ = 0x7fffffff;
        auVar9._0_8_ = 0x7fffffff7fffffff;
        auVar9._12_4_ = 0x7fffffff;
        auVar16 = vandps_avx512vl(auVar15,auVar9);
        auVar26._0_4_ = fVar17 / fVar14;
        auVar26._4_12_ = auVar15._4_12_;
        auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar26,ZEXT416(0x3fc90fdb));
        auVar21 = vshufps_avx(auVar16,auVar16,0xf5);
        bVar6 = auVar21._0_4_ < auVar16._0_4_;
        fVar13 = (float)((uint)bVar6 * (int)((fVar14 / fVar17) * 0.7853982) +
                        (uint)!bVar6 * auVar3._0_4_);
        fVar14 = (float)((uint)bVar6 * (int)fVar17 + (uint)!bVar6 * (int)fVar14);
        fVar17 = cosf(fVar13);
        fVar13 = sinf(fVar13);
        auVar21 = ZEXT416((uint)auVar22._0_4_);
        local_68 = vinsertps_avx(ZEXT416((uint)(fVar14 * fVar17)),ZEXT416((uint)(fVar14 * fVar13)),
                                 0x10);
      }
      auVar3 = vmovshdup_avx(local_68);
      auVar15 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),local_68,local_68);
      auVar3 = vfnmadd213ss_fma(auVar3,auVar3,auVar15);
      uVar12 = vcmpss_avx512f(auVar21,ZEXT816(0) << 0x20,1);
      bVar6 = (bool)((byte)uVar12 & 1);
      auVar3 = vmaxss_avx(auVar3,ZEXT816(0) << 0x20);
      auVar3 = vsqrtss_avx(auVar3,auVar3);
      auVar10._8_4_ = 0x80000000;
      auVar10._0_8_ = 0x8000000080000000;
      auVar10._12_4_ = 0x80000000;
      auVar15 = vxorps_avx512vl(auVar3,auVar10);
      local_58 = (float)((uint)bVar6 * auVar15._0_4_ + (uint)!bVar6 * (int)auVar3._0_4_);
      fVar14 = fVar7 * auVar3._0_4_ * 0.31830987;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = auVar21._0_4_;
      auVar25 = ZEXT856(auVar21._8_8_);
      auVar20 = ZEXT856(in_XMM0_Qb);
      wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_68._0_8_;
      wi.super_Tuple3<pbrt::Vector3,_float>.z = local_58;
      SVar28 = f(this,wo_00,wi,mode);
      auVar23._0_8_ = SVar28.values.values._8_8_;
      auVar23._8_56_ = auVar25;
      auVar19._0_8_ = SVar28.values.values._0_8_;
      auVar19._8_56_ = auVar20;
      auVar21 = vmovlhps_avx(auVar19._0_16_,auVar23._0_16_);
      __return_storage_ptr__->set = true;
      uVar12 = 0x3f80000000000005;
    }
    *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar21;
    uVar2 = vmovlps_avx(local_68);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_58;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = fVar14 / (fVar7 + fVar8);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = uVar12;
    (__return_storage_ptr__->optionalValue).__data[0x28] = '\0';
  }
  else {
    *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x10) = ZEXT432(0) << 0x40
    ;
    *(undefined1 (*) [32])&__return_storage_ptr__->optionalValue = ZEXT432(0) << 0x40;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<BSDFSample> Sample_f(
        Vector3f wo, Float uc, Point2f u, TransportMode mode,
        BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        // Compute reflection and transmission probabilities for diffuse BSDF
        Float pr = R.MaxComponentValue(), pt = T.MaxComponentValue();
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        // Randomly sample diffuse BSDF reflection or transmission
        if (uc < pr / (pr + pt)) {
            // Sample diffuse BSDF reflection
            Vector3f wi = SampleCosineHemisphere(u);
            if (wo.z < 0)
                wi.z *= -1;
            Float pdf = CosineHemispherePDF(AbsCosTheta(wi)) * pr / (pr + pt);
            return BSDFSample(f(wo, wi, mode), wi, pdf, BxDFFlags::DiffuseReflection);

        } else {
            // Sample diffuse BSDF transmission
            Vector3f wi = SampleCosineHemisphere(u);
            if (wo.z > 0)
                wi.z *= -1;
            Float pdf = CosineHemispherePDF(AbsCosTheta(wi)) * pt / (pr + pt);
            return BSDFSample(f(wo, wi, mode), wi, pdf, BxDFFlags::DiffuseTransmission);
        }
    }